

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
::_positive_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  Column_dimension_option CVar5;
  ID_index IVar6;
  bool bVar7;
  ID_index IVar8;
  long lVar9;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar10;
  Column *col;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar11;
  ID_index IVar12;
  long lVar13;
  long lVar14;
  anon_class_1_0_00000001 local_47;
  anon_class_1_0_00000001 local_46;
  anon_class_1_0_00000001 local_45;
  Index local_44;
  anon_class_8_1_e4bd5e45 local_40;
  ulong local_38;
  
  lVar4 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  lVar13 = (ulong)columnIndex1 * 0x40;
  lVar14 = (ulong)columnIndex2 * 0x40;
  pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
             *)(lVar14 + lVar4);
  local_44 = columnIndex2;
  if (*(int *)(lVar4 + 0x18 + lVar13) == -1) {
    local_40.targetColumn._0_4_ = columnIndex1;
    if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001d1f4d:
      local_40.targetColumn._0_4_ = columnIndex1;
      std::__throw_bad_function_call();
    }
    bVar7 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_40,&local_44);
    lVar4 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
    if ((bVar7) && ((pIVar11->super_Chain_column_option).pairedColumn_ == 0xffffffff)) {
      pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)(lVar4 + lVar14);
      IVar12 = *(ID_index *)(lVar4 + 0x14 + lVar14);
      pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)(lVar13 + lVar4);
      local_40.targetColumn = pIVar11;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar7) {
        CVar5.dim_ = (pIVar11->super_Column_dimension_option).dim_;
        IVar6 = (pIVar11->super_Chain_column_option).pivot_;
        IVar8 = (pIVar10->super_Chain_column_option).pivot_;
        pIVar11->super_Column_dimension_option =
             (Column_dimension_option)(pIVar10->super_Column_dimension_option).dim_;
        (pIVar11->super_Chain_column_option).pivot_ = IVar8;
        pIVar10->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
        (pIVar10->super_Chain_column_option).pivot_ = IVar6;
      }
      IVar8 = (pIVar11->super_Chain_column_option).pivot_;
      local_38._0_4_ = columnIndex1;
      if (IVar12 == IVar8) {
        return columnIndex1;
      }
      goto LAB_001d1f26;
    }
    IVar12 = *(ID_index *)(lVar4 + 0x14 + lVar13);
LAB_001d1ede:
    pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
               *)(lVar4 + lVar13);
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
               *)(lVar14 + lVar4);
    local_40.targetColumn = pIVar11;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    if (bVar7) {
      CVar5.dim_ = (pIVar11->super_Column_dimension_option).dim_;
      IVar6 = (pIVar11->super_Chain_column_option).pivot_;
      IVar8 = (pIVar10->super_Chain_column_option).pivot_;
      pIVar11->super_Column_dimension_option =
           (Column_dimension_option)(pIVar10->super_Column_dimension_option).dim_;
      (pIVar11->super_Chain_column_option).pivot_ = IVar8;
      pIVar10->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
      (pIVar10->super_Chain_column_option).pivot_ = IVar6;
    }
  }
  else {
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
               *)(lVar4 + lVar13);
    if ((pIVar11->super_Chain_column_option).pairedColumn_ != 0xffffffff) {
      local_38 = CONCAT44(local_38._4_4_,columnIndex1);
      local_40.targetColumn._0_4_ = columnIndex1;
      if ((this->deathComp_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_001d1f4d;
      bVar7 = (*(this->deathComp_)._M_invoker)
                        ((_Any_data *)&this->deathComp_,(uint *)&local_40,&local_44);
      lVar4 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
      if (bVar7) {
        lVar9 = (ulong)(pIVar11->super_Chain_column_option).pairedColumn_ * 0x40;
        pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)(lVar4 + lVar9);
        uVar1 = *(uint *)(lVar4 + 0x14 + lVar9);
        pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)((ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x40 + lVar4);
        local_40.targetColumn = pIVar11;
        bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar7) {
          CVar5.dim_ = (pIVar11->super_Column_dimension_option).dim_;
          IVar8 = (pIVar11->super_Chain_column_option).pivot_;
          IVar12 = (pIVar10->super_Chain_column_option).pivot_;
          pIVar11->super_Column_dimension_option =
               (Column_dimension_option)(pIVar10->super_Column_dimension_option).dim_;
          (pIVar11->super_Chain_column_option).pivot_ = IVar12;
          pIVar10->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
          (pIVar10->super_Chain_column_option).pivot_ = IVar8;
        }
        uVar2 = (pIVar11->super_Chain_column_option).pivot_;
        if (uVar1 != uVar2) {
          lVar4 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
          uVar3 = *(undefined4 *)(lVar4 + (ulong)uVar1 * 4);
          *(undefined4 *)(lVar4 + (ulong)uVar1 * 4) = *(undefined4 *)(lVar4 + (ulong)uVar2 * 4);
          *(undefined4 *)(lVar4 + (ulong)uVar2 * 4) = uVar3;
        }
        lVar4 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
        pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)(lVar4 + lVar14);
        IVar12 = *(ID_index *)(lVar4 + 0x14 + lVar14);
        pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)(lVar13 + lVar4);
        local_40.targetColumn = pIVar11;
        bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar7) {
          CVar5.dim_ = (pIVar11->super_Column_dimension_option).dim_;
          IVar6 = (pIVar11->super_Chain_column_option).pivot_;
          IVar8 = (pIVar10->super_Chain_column_option).pivot_;
          pIVar11->super_Column_dimension_option =
               (Column_dimension_option)(pIVar10->super_Column_dimension_option).dim_;
          (pIVar11->super_Chain_column_option).pivot_ = IVar8;
          pIVar10->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
          (pIVar10->super_Chain_column_option).pivot_ = IVar6;
        }
        IVar8 = (pIVar11->super_Chain_column_option).pivot_;
        if (IVar12 == IVar8) {
          return (Index)local_38;
        }
        goto LAB_001d1f26;
      }
      lVar9 = (ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x40;
      pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)(lVar4 + lVar9);
      local_38 = (ulong)*(uint *)(lVar4 + 0x14 + lVar9);
      pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)((ulong)(pIVar11->super_Chain_column_option).pairedColumn_ * 0x40 + lVar4);
      local_40.targetColumn = pIVar10;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar11,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar7) {
        CVar5.dim_ = (pIVar10->super_Column_dimension_option).dim_;
        IVar8 = (pIVar10->super_Chain_column_option).pivot_;
        IVar12 = (pIVar11->super_Chain_column_option).pivot_;
        pIVar10->super_Column_dimension_option =
             (Column_dimension_option)(pIVar11->super_Column_dimension_option).dim_;
        (pIVar10->super_Chain_column_option).pivot_ = IVar12;
        pIVar11->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
        (pIVar11->super_Chain_column_option).pivot_ = IVar8;
      }
      uVar1 = (pIVar10->super_Chain_column_option).pivot_;
      if ((uint)local_38 != uVar1) {
        lVar4 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
        uVar3 = *(undefined4 *)(lVar4 + local_38 * 4);
        *(undefined4 *)(lVar4 + local_38 * 4) = *(undefined4 *)(lVar4 + (ulong)uVar1 * 4);
        *(undefined4 *)(lVar4 + (ulong)uVar1 * 4) = uVar3;
      }
      lVar4 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
      IVar12 = *(ID_index *)(lVar4 + 0x14 + lVar13);
      goto LAB_001d1ede;
    }
    IVar12 = (pIVar11->super_Chain_column_option).pivot_;
    local_40.targetColumn = pIVar11;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    columnIndex2 = columnIndex1;
    if (bVar7) {
      CVar5.dim_ = (pIVar11->super_Column_dimension_option).dim_;
      IVar6 = (pIVar11->super_Chain_column_option).pivot_;
      IVar8 = (pIVar10->super_Chain_column_option).pivot_;
      pIVar11->super_Column_dimension_option =
           (Column_dimension_option)(pIVar10->super_Column_dimension_option).dim_;
      (pIVar11->super_Chain_column_option).pivot_ = IVar8;
      pIVar10->super_Column_dimension_option = (Column_dimension_option)CVar5.dim_;
      (pIVar10->super_Chain_column_option).pivot_ = IVar6;
    }
  }
  IVar8 = (pIVar11->super_Chain_column_option).pivot_;
  local_38._0_4_ = columnIndex2;
  if (IVar12 == IVar8) {
    return columnIndex2;
  }
LAB_001d1f26:
  lVar4 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
  uVar3 = *(undefined4 *)(lVar4 + (ulong)IVar12 * 4);
  *(undefined4 *)(lVar4 + (ulong)IVar12 * 4) = *(undefined4 *)(lVar4 + (ulong)IVar8 * 4);
  *(undefined4 *)(lVar4 + (ulong)IVar8 * 4) = uVar3;
  return (Index)local_38;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }
  // TODO: factorize the cases
  // But for debug it is much more easier to understand what is happening when split like this
  if (!col1.is_paired()) {  // F x *
    bool hasSmallerBirth;
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      // this order because position were swapped with CP::swap_positions
      hasSmallerBirth = (CP::birth(col2.get_pivot()) < CP::birth(col1.get_pivot()));
    } else {
      hasSmallerBirth = birthComp_(columnIndex1, columnIndex2);
    }

    if (!col2.is_paired() && hasSmallerBirth) {
      _matrix()->add_to(columnIndex1, columnIndex2);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
      }
      return columnIndex1;
    }
    _matrix()->add_to(columnIndex2, columnIndex1);

    return columnIndex2;
  }

  if (!col2.is_paired()) {  // G x F
    static_cast<Master_chain_matrix*>(this)->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  bool hasSmallerDeath;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    // this order because position were swapped with CP::swap_positions
    hasSmallerDeath = (CP::death(col2.get_pivot()) < CP::death(col1.get_pivot()));
  } else {
    hasSmallerDeath = deathComp_(columnIndex1, columnIndex2);
  }

  // G x G
  if (hasSmallerDeath)
  {
    _matrix()->add_to(col1.get_paired_chain_index(), col2.get_paired_chain_index());
    _matrix()->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  _matrix()->add_to(col2.get_paired_chain_index(), col1.get_paired_chain_index());
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}